

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  cmTarget *pcVar1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar2;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar3;
  bool bVar4;
  long *plVar5;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  long lVar8;
  char *pcVar9;
  cmCustomCommand *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  cmGlobalNinjaGenerator *pcVar12;
  cmGeneratedFileStream *pcVar13;
  size_type *psVar14;
  pointer cc;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  pointer ppcVar17;
  bool uses_terminal;
  string local_248;
  allocator_type local_219;
  cmCustomCommandGenerator ccg;
  string command;
  string config;
  string desc;
  cmNinjaDeps local_158;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmNinjaDeps deps;
  string utilCommandName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmNinjaDeps outputs;
  cmNinjaDeps util_outputs;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [2];
  cmNinjaDeps local_68;
  cmNinjaDeps local_48;
  bool bVar18;
  
  utilCommandName._M_dataplus._M_p = (pointer)&utilCommandName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utilCommandName,"CMakeFiles/","");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&config,&this->super_cmNinjaTargetGenerator);
  plVar5 = (long *)std::__cxx11::string::append((char *)&config);
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  pcVar10 = (cmCustomCommand *)(plVar5 + 2);
  if ((cmCustomCommand *)*plVar5 == pcVar10) {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar10->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.Config.field_2._M_allocated_capacity = plVar5[3];
  }
  else {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar10->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.CC = (cmCustomCommand *)*plVar5;
  }
  ccg.Config._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)pcVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&utilCommandName,(ulong)ccg.CC);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  pcVar1 = (this->super_cmNinjaTargetGenerator).Target;
  cmdLists[0] = &pcVar1->PreBuildCommands;
  cmdLists[1] = &pcVar1->PostBuildCommands;
  lVar8 = 0;
  bVar18 = false;
  uses_terminal = false;
  do {
    pvVar2 = cmdLists[lVar8];
    for (cc = (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_start;
        cc != (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_finish; cc = cc + 1) {
      psVar6 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator)
      ;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,cc,psVar6,(this->super_cmNinjaTargetGenerator).Makefile);
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&deps);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&commands);
      pvVar7 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmLocalNinjaGenerator::map_to_ninja_path>
                ((pvVar7->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar7->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,&util_outputs,
                 (this->super_cmNinjaTargetGenerator).LocalGenerator);
      bVar4 = cmCustomCommand::GetUsesTerminal(cc);
      uses_terminal = bVar18;
      if (bVar4) {
        uses_terminal = true;
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      bVar18 = uses_terminal;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmNinjaTargetGenerator).Makefile;
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"CMAKE_BUILD_TYPE","");
  pcVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)&ccg);
  std::__cxx11::string::string((string *)&config,pcVar9,(allocator *)&command);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  cmTarget::GetSourceFiles((this->super_cmNinjaTargetGenerator).Target,&sources,&config);
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar17 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar10 = cmSourceFile::GetCustomCommand(*ppcVar17);
      if (pcVar10 != (cmCustomCommand *)0x0) {
        psVar6 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_
                           (&this->super_cmNinjaTargetGenerator);
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  (&ccg,pcVar10,psVar6,(this->super_cmNinjaTargetGenerator).Makefile);
        cmLocalNinjaGenerator::AddCustomCommandTarget
                  ((this->super_cmNinjaTargetGenerator).LocalGenerator,pcVar10,
                   (this->super_cmNinjaTargetGenerator).Target);
        pvVar7 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
        pvVar11 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmLocalNinjaGenerator::map_to_ninja_path>
                  ((pvVar7->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar7->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,&deps,
                   (this->super_cmNinjaTargetGenerator).LocalGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmLocalNinjaGenerator::map_to_ninja_path>
                  ((pvVar11->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar11->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,&deps,
                   (this->super_cmNinjaTargetGenerator).LocalGenerator);
        cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      }
      ppcVar17 = ppcVar17 + 1;
    } while (ppcVar17 !=
             sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).Target,&outputs);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).Target,&deps);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar12 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar13 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&desc,0,(char *)0x0,0x5045c0);
    psVar14 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar14) {
      command.field_2._M_allocated_capacity = *psVar14;
      command.field_2._8_8_ = plVar5[3];
      command._M_dataplus._M_p = (pointer)&command.field_2;
    }
    else {
      command.field_2._M_allocated_capacity = *psVar14;
      command._M_dataplus._M_p = (pointer)*plVar5;
    }
    command._M_string_length = plVar5[1];
    *plVar5 = (long)psVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_248.field_2._M_allocated_capacity = 0;
    local_248._M_dataplus._M_p = (pointer)0x0;
    local_248._M_string_length = 0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
    ccg.Config._M_string_length = 0;
    ccg.CC = (cmCustomCommand *)0x0;
    ccg.Config._M_dataplus._M_p = (pointer)0x0;
    ccg.Makefile = (cmMakefile *)0x0;
    ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar12,(ostream *)pcVar13,&command,&outputs,&deps,(cmNinjaDeps *)&local_248,
               &local_158,(cmNinjaVars *)&ccg);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&ccg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p != &command.field_2) {
      operator_delete(command._M_dataplus._M_p,command.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      uVar15 = CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]);
      _Var16._M_p = desc._M_dataplus._M_p;
LAB_00350303:
      operator_delete(_Var16._M_p,uVar15 + 1);
    }
LAB_0035030b:
    pcVar12 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias
              (pcVar12,(string *)&ccg,(this->super_cmNinjaTargetGenerator).Target);
    uVar15 = ccg.Config._M_string_length;
    _Var16._M_p = (pointer)ccg.CC;
    if (ccg.CC == (cmCustomCommand *)&ccg.Config._M_string_length) goto LAB_00350358;
  }
  else {
    cmLocalNinjaGenerator::BuildCommandLine
              (&command,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commands);
    pcVar1 = (this->super_cmNinjaTargetGenerator).Target;
    ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"EchoString","");
    pcVar9 = cmTarget::GetProperty(pcVar1,(string *)&ccg);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    if (pcVar9 == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_248,&this->super_cmNinjaTargetGenerator);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x5045d5);
      psVar14 = &ccg.Config._M_string_length;
      pcVar10 = (cmCustomCommand *)(plVar5 + 2);
      if ((cmCustomCommand *)*plVar5 == pcVar10) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar10->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar5[3];
        ccg.CC = (cmCustomCommand *)psVar14;
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar10->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar5;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)pcVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccg);
      if (ccg.CC != (cmCustomCommand *)psVar14) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&desc,0,(char *)0x0,(ulong)pcVar9);
    }
    pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar9 = cmMakefile::GetHomeDirectory(((this->super_cmNinjaTargetGenerator).Target)->Makefile);
    std::__cxx11::string::string((string *)&local_248,pcVar9,(allocator *)&local_158);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,&(pcVar3->super_cmLocalGenerator).super_cmOutputConverter,&local_248,
               SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_SOURCE_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar9 = cmMakefile::GetHomeOutputDirectory
                       (((this->super_cmNinjaTargetGenerator).Target)->Makefile);
    std::__cxx11::string::string((string *)&local_248,pcVar9,(allocator *)&local_158);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,&(pcVar3->super_cmLocalGenerator).super_cmOutputConverter,&local_248,
               SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_BINARY_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ReplaceString(&command,"$(ARGS)","");
    lVar8 = std::__cxx11::string::find((char)&command,0x24);
    if (lVar8 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        pcVar12 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (pcVar12,util_outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar12 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_248,&this->super_cmNinjaTargetGenerator);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x5045c0);
      ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
      pcVar10 = (cmCustomCommand *)(plVar5 + 2);
      if ((cmCustomCommand *)*plVar5 == pcVar10) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar10->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar5[3];
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar10->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar5;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)pcVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (pcVar12,&command,&desc,(string *)&ccg,uses_terminal,&util_outputs,&deps,&local_158)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar13 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_158,1,&utilCommandName,&local_219);
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
      ccg.Config._M_string_length = 0;
      ccg.CC = (cmCustomCommand *)0x0;
      ccg.Config._M_dataplus._M_p = (pointer)0x0;
      ccg.Makefile = (cmMakefile *)0x0;
      ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
      cmGlobalNinjaGenerator::WritePhonyBuild
                (pcVar12,(ostream *)pcVar13,&local_248,&outputs,&local_158,&local_48,&local_68,
                 (cmNinjaVars *)&ccg);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&ccg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)desc._M_dataplus._M_p != &desc.field_2) {
        operator_delete(desc._M_dataplus._M_p,
                        CONCAT71(desc.field_2._M_allocated_capacity._1_7_,
                                 desc.field_2._M_local_buf[0]) + 1);
      }
      uVar15 = command.field_2._M_allocated_capacity;
      _Var16._M_p = command._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)command._M_dataplus._M_p != &command.field_2) goto LAB_00350303;
      goto LAB_0035030b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
    }
    uVar15 = command.field_2._M_allocated_capacity;
    _Var16._M_p = command._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p == &command.field_2) goto LAB_00350358;
  }
  operator_delete(_Var16._M_p,uVar15 + 1);
LAB_00350358:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)utilCommandName._M_dataplus._M_p != &utilCommandName.field_2) {
    operator_delete(utilCommandName._M_dataplus._M_p,
                    utilCommandName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  std::string utilCommandName = cmake::GetCMakeFilesDirectoryPostSlash();
  utilCommandName += this->GetTargetName() + ".util";

  std::vector<std::string> commands;
  cmNinjaDeps deps, outputs, util_outputs(1, utilCommandName);

  const std::vector<cmCustomCommand> *cmdLists[2] = {
    &this->GetTarget()->GetPreBuildCommands(),
    &this->GetTarget()->GetPostBuildCommands()
  };

  bool uses_terminal = false;

  for (unsigned i = 0; i != 2; ++i) {
    for (std::vector<cmCustomCommand>::const_iterator
         ci = cmdLists[i]->begin(); ci != cmdLists[i]->end(); ++ci) {
      cmCustomCommandGenerator ccg(*ci, this->GetConfigName(),
                                   this->GetMakefile());
      this->GetLocalGenerator()->AppendCustomCommandDeps(ccg, deps);
      this->GetLocalGenerator()->AppendCustomCommandLines(ccg, commands);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(util_outputs), MapToNinjaPath());
      if (ci->GetUsesTerminal())
        uses_terminal = true;
    }
  }

  std::vector<cmSourceFile*> sources;
  std::string config = this->GetMakefile()
                           ->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->GetTarget()->GetSourceFiles(sources, config);
  for(std::vector<cmSourceFile*>::const_iterator source = sources.begin();
      source != sources.end(); ++source)
    {
    if(cmCustomCommand* cc = (*source)->GetCustomCommand())
      {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetMakefile());
      this->GetLocalGenerator()->AddCustomCommandTarget(cc, this->GetTarget());

      // Depend on all custom command outputs.
      const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
      std::transform(ccOutputs.begin(), ccOutputs.end(),
                     std::back_inserter(deps), MapToNinjaPath());
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(deps), MapToNinjaPath());
      }
    }

  this->GetLocalGenerator()->AppendTargetOutputs(this->GetTarget(), outputs);
  this->GetLocalGenerator()->AppendTargetDepends(this->GetTarget(), deps);

  if (commands.empty()) {
    this->GetGlobalGenerator()->WritePhonyBuild(this->GetBuildFileStream(),
                                                "Utility command for "
                                                  + this->GetTargetName(),
                                                outputs,
                                                deps);
  } else {
    std::string command =
      this->GetLocalGenerator()->BuildCommandLine(commands);
    const char *echoStr = this->GetTarget()->GetProperty("EchoString");
    std::string desc;
    if (echoStr)
      desc = echoStr;
    else
      desc = "Running utility command for " + this->GetTargetName();

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command,
      "$(CMAKE_SOURCE_DIR)",
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->GetTarget()->GetMakefile()->GetHomeDirectory(),
        cmLocalGenerator::SHELL).c_str());
    cmSystemTools::ReplaceString(
      command,
      "$(CMAKE_BINARY_DIR)",
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->GetTarget()->GetMakefile()->GetHomeOutputDirectory(),
        cmLocalGenerator::SHELL).c_str());
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos)
      return;

    for (cmNinjaDeps::const_iterator
           oi = util_outputs.begin(), oe = util_outputs.end();
         oi != oe; ++oi)
      {
      this->GetGlobalGenerator()->SeenCustomCommandOutput(*oi);
      }

    this->GetGlobalGenerator()->WriteCustomCommandBuild(
      command,
      desc,
      "Utility command for " + this->GetTargetName(),
      uses_terminal,
      util_outputs,
      deps);

    this->GetGlobalGenerator()->WritePhonyBuild(this->GetBuildFileStream(),
                                                "",
                                                outputs,
                                                cmNinjaDeps(1, utilCommandName)
                                                );
  }

  this->GetGlobalGenerator()->AddTargetAlias(this->GetTargetName(),
                                             this->GetTarget());
}